

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::TemplatedWritePlain<duckdb::float_na_equal,float,duckdb::FloatingPointOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  float target_value;
  data_ptr_t pdVar1;
  long lVar2;
  float local_write [2048];
  float local_2038 [2050];
  
  if (chunk_start < chunk_end) {
    pdVar1 = col->data;
    lVar2 = 0;
    do {
      target_value = *(float *)(pdVar1 + chunk_start * 4);
      FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>(stats,target_value);
      local_2038[lVar2] = target_value;
      lVar2 = lVar2 + 1;
      if (lVar2 == 0x800) {
        (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
                  (mask,local_2038,0x2000);
        lVar2 = 0;
      }
      chunk_start = chunk_start + 1;
    } while (chunk_end != chunk_start);
    lVar2 = lVar2 << 2;
  }
  else {
    lVar2 = 0;
  }
  (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
            (mask,local_2038,lVar2);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}